

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O1

void __thiscall FGLDebug::OutputMessageLog(FGLDebug *this)

{
  GLenum severity;
  GLuint GVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  uint amount;
  ulong uVar4;
  int iVar5;
  TArray<int,_int> lengths;
  TArray<char,_char> messageLog;
  TArray<unsigned_int,_unsigned_int> severities;
  TArray<unsigned_int,_unsigned_int> types;
  TArray<unsigned_int,_unsigned_int> ids;
  TArray<unsigned_int,_unsigned_int> sources;
  GLint maxDebugMessageLength;
  
  if (this->mCurrentLevel != 0) {
    maxDebugMessageLength = 0;
    (*_ptrc_glGetIntegerv)(0x9143,&maxDebugMessageLength);
    amount = maxDebugMessageLength * 0x32;
    sources.Array = (uint *)0x0;
    sources.Most = 0;
    sources.Count = 0;
    types.Array = (uint *)0x0;
    types.Most = 0;
    types.Count = 0;
    severities.Array = (uint *)0x0;
    severities.Most = 0;
    severities.Count = 0;
    ids.Array = (uint *)0x0;
    ids.Most = 0;
    ids.Count = 0;
    lengths.Array = (int *)0x0;
    lengths.Most = 0;
    lengths.Count = 0;
    messageLog.Array = (char *)0x0;
    messageLog.Most = 0;
    messageLog.Count = 0;
    TArray<unsigned_int,_unsigned_int>::Resize(&sources,0x32);
    TArray<unsigned_int,_unsigned_int>::Resize(&types,0x32);
    TArray<unsigned_int,_unsigned_int>::Resize(&severities,0x32);
    TArray<unsigned_int,_unsigned_int>::Resize(&ids,0x32);
    TArray<int,_int>::Resize(&lengths,0x32);
    TArray<char,_char>::Resize(&messageLog,amount);
    do {
      GVar1 = (*_ptrc_glGetDebugMessageLog)
                        (0x32,amount,sources.Array,types.Array,ids.Array,severities.Array,
                         lengths.Array,messageLog.Array);
      if (GVar1 == 0) break;
      uVar4 = 0;
      iVar5 = 0;
      uVar3 = extraout_RDX;
      do {
        severity = severities.Array[uVar4];
        if ((int)severity < 0x9147) {
          if (severity == 0x826b) {
            iVar2 = 4;
          }
          else {
            iVar2 = 0;
            if (severity == 0x9146) {
              iVar2 = 1;
            }
          }
        }
        else if (severity == 0x9147) {
          iVar2 = 2;
        }
        else {
          iVar2 = 0;
          if (severity == 0x9148) {
            iVar2 = 3;
          }
        }
        if (iVar2 <= gl_debug_level.Value) {
          PrintMessage(sources.Array[uVar4],types.Array[uVar4],(GLuint)uVar3,severity,
                       lengths.Array[uVar4],messageLog.Array + iVar5);
          uVar3 = extraout_RDX_00;
        }
        iVar5 = iVar5 + lengths.Array[uVar4];
        uVar4 = uVar4 + 1;
      } while (GVar1 != uVar4);
    } while (GVar1 != 0);
    TArray<char,_char>::~TArray(&messageLog);
    TArray<int,_int>::~TArray(&lengths);
    TArray<unsigned_int,_unsigned_int>::~TArray(&ids);
    TArray<unsigned_int,_unsigned_int>::~TArray(&severities);
    TArray<unsigned_int,_unsigned_int>::~TArray(&types);
    TArray<unsigned_int,_unsigned_int>::~TArray(&sources);
  }
  return;
}

Assistant:

void FGLDebug::OutputMessageLog()
{
	if (mCurrentLevel <= 0)
		return;

	GLint maxDebugMessageLength = 0;
	glGetIntegerv(GL_MAX_DEBUG_MESSAGE_LENGTH, &maxDebugMessageLength);

	const int maxMessages = 50;
	const int messageLogSize = maxMessages * maxDebugMessageLength;

	TArray<GLenum> sources, types, severities;
	TArray<GLuint> ids;
	TArray<GLsizei> lengths;
	TArray<GLchar> messageLog;

	sources.Resize(maxMessages);
	types.Resize(maxMessages);
	severities.Resize(maxMessages);
	ids.Resize(maxMessages);
	lengths.Resize(maxMessages);
	messageLog.Resize(messageLogSize);

	while (true)
	{
		GLuint numMessages = glGetDebugMessageLog(maxMessages, messageLogSize, &sources[0], &types[0], &ids[0], &severities[0], &lengths[0], &messageLog[0]);
		if (numMessages <= 0) break;

		GLsizei offset = 0;
		for (GLuint i = 0; i < numMessages; i++)
		{
			if (!IsFilteredByDebugLevel(severities[i]))
				PrintMessage(sources[i], types[i], ids[i], severities[i], lengths[i], &messageLog[offset]);
			offset += lengths[i];
		}
	}
}